

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O1

HTTP_HEADERS_HANDLE
createIotHubRequestHttpHeaders(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *upload_data)

{
  IOTHUB_AUTHORIZATION_HANDLE handle;
  HTTP_HEADERS_RESULT HVar1;
  HTTP_HEADERS_HANDLE httpHeadersHandle;
  STRING_HANDLE handle_00;
  time_t __time1;
  ulong uVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  double dVar6;
  
  httpHeadersHandle = HTTPHeaders_Alloc();
  if (httpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"createIotHubRequestHttpHeaders",0x11b,1,
                "Failed to allocate HTTP headers for IoT Hub connection");
      return (HTTP_HEADERS_HANDLE)0x0;
    }
  }
  else {
    HVar1 = HTTPHeaders_AddHeaderNameValuePair(httpHeadersHandle,"Content-Type","application/json");
    if (((HVar1 == HTTP_HEADERS_OK) &&
        (HVar1 = HTTPHeaders_AddHeaderNameValuePair(httpHeadersHandle,"Accept","application/json"),
        HVar1 == HTTP_HEADERS_OK)) &&
       (HVar1 = HTTPHeaders_AddHeaderNameValuePair
                          (httpHeadersHandle,"User-Agent","iothubclient/1.15.0"),
       HVar1 == HTTP_HEADERS_OK)) {
      switch(upload_data->cred_type) {
      case IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY:
        HVar1 = HTTPHeaders_AddHeaderNameValuePair(httpHeadersHandle,"Authorization","");
        if (HVar1 == HTTP_HEADERS_OK) {
          return httpHeadersHandle;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar5 = "unable to add authorization header";
          iVar4 = 0x140;
LAB_00127608:
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"createIotHubRequestHttpHeaders",iVar4,1,pcVar5);
        }
        break;
      case IOTHUB_CREDENTIAL_TYPE_X509:
      case IOTHUB_CREDENTIAL_TYPE_X509_ECC:
        goto switchD_00127593_caseD_2;
      case IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN:
        HVar1 = HTTPHeaders_AddHeaderNameValuePair
                          (httpHeadersHandle,"Authorization",
                           (upload_data->credentials).x509_credentials.x509certificate);
        if (HVar1 == HTTP_HEADERS_OK) {
          return httpHeadersHandle;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar5 = "unable to add authorization header";
          iVar4 = 0x17d;
          goto LAB_00127608;
        }
        break;
      case IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH:
        handle_00 = STRING_construct_sprintf
                              ("%s/devices/%s",upload_data->hostname,upload_data->deviceId);
        if (handle_00 == (STRING_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar5 = "Failure constructing uri string";
            iVar4 = 0x14f;
            goto LAB_00127608;
          }
        }
        else {
          __time1 = get_time((time_t *)0x0);
          if (__time1 == -1) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              pcVar5 = "failure retrieving time";
              iVar4 = 0x157;
LAB_00127835:
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                        ,"createIotHubRequestHttpHeaders",iVar4,1,pcVar5);
            }
          }
          else {
            dVar6 = difftime(__time1,0);
            uVar2 = (ulong)(dVar6 + 3600.0);
            handle = upload_data->authorization_module;
            pcVar5 = STRING_c_str(handle_00);
            pcVar5 = IoTHubClient_Auth_Get_SasToken
                               (handle,pcVar5,
                                (long)((dVar6 + 3600.0) - 9.223372036854776e+18) &
                                (long)uVar2 >> 0x3f | uVar2,"");
            if (pcVar5 == (char *)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                pcVar5 = "unable to retrieve sas token";
                iVar4 = 0x161;
                goto LAB_00127835;
              }
            }
            else {
              HVar1 = HTTPHeaders_AddHeaderNameValuePair(httpHeadersHandle,"Authorization",pcVar5);
              if (HVar1 == HTTP_HEADERS_OK) {
                free(pcVar5);
                STRING_delete(handle_00);
                return httpHeadersHandle;
              }
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                          ,"createIotHubRequestHttpHeaders",0x168,1,
                          "unable to HTTPHeaders_AddHeaderNameValuePair");
              }
              free(pcVar5);
            }
          }
          STRING_delete(handle_00);
        }
        break;
      default:
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar5 = "Internal Error: unexpected value in auth schema = %d";
          iVar4 = 0x12e;
          goto LAB_00127608;
        }
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar5 = "unable to add HTTP headers";
        iVar4 = 0x125;
        goto LAB_00127608;
      }
    }
    HTTPHeaders_Free(httpHeadersHandle);
  }
  httpHeadersHandle = (HTTP_HEADERS_HANDLE)0x0;
switchD_00127593_caseD_2:
  return httpHeadersHandle;
}

Assistant:

static HTTP_HEADERS_HANDLE createIotHubRequestHttpHeaders(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data)
{
    HTTP_HEADERS_HANDLE iotHubRequestHttpHeaders;

    if ((iotHubRequestHttpHeaders = HTTPHeaders_Alloc()) == NULL)
    {
        LogError("Failed to allocate HTTP headers for IoT Hub connection");
    }
    else
    {
        bool isError;

        if ((HTTPHeaders_AddHeaderNameValuePair(iotHubRequestHttpHeaders, "Content-Type", HEADER_APP_JSON) != HTTP_HEADERS_OK) ||
            (HTTPHeaders_AddHeaderNameValuePair(iotHubRequestHttpHeaders, "Accept", HEADER_APP_JSON) != HTTP_HEADERS_OK) ||
            (HTTPHeaders_AddHeaderNameValuePair(iotHubRequestHttpHeaders, "User-Agent", "iothubclient/" IOTHUB_SDK_VERSION) != HTTP_HEADERS_OK))
        {
            LogError("unable to add HTTP headers");
            isError = true;
        }
        else
        {
            switch (upload_data->cred_type)
            {
                default:
                {
                    LogError("Internal Error: unexpected value in auth schema = %d", upload_data->cred_type);
                    isError = true;
                    break;
                }
                case IOTHUB_CREDENTIAL_TYPE_X509_ECC:
                case IOTHUB_CREDENTIAL_TYPE_X509:
                {
                    isError = false;
                    break;
                }
                case IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY:
                {
                    // This is the scenario that uses `send_http_sas_request`.
                    // Believe it or not, HTTPAPIEX_SAS_ExecuteRequest requires the headers to have
                    // an empty Authorization header so it can replace it with the authorization value. 

                    if (HTTPHeaders_AddHeaderNameValuePair(iotHubRequestHttpHeaders, HEADER_AUTHORIZATION, EMPTY_STRING) != HTTP_HEADERS_OK)
                    {
                        LogError("unable to add authorization header");
                        isError = true;
                    }
                    else
                    {
                        isError = false;
                    }
                    break;
                }
                case IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH:
                {
                    STRING_HANDLE uri_resource = STRING_construct_sprintf("%s/devices/%s", upload_data->hostname, upload_data->deviceId);

                    if (uri_resource == NULL)
                    {
                        LogError("Failure constructing uri string");
                        isError = true;
                    }
                    else
                    {
                        time_t curr_time;
                        if ((curr_time = get_time(NULL)) == INDEFINITE_TIME)
                        {
                            LogError("failure retrieving time");
                            isError = true;
                        }
                        else
                        {
                            uint64_t expiry = (uint64_t)(difftime(curr_time, 0) + 3600);
                            char* sas_token = IoTHubClient_Auth_Get_SasToken(upload_data->authorization_module, STRING_c_str(uri_resource), expiry, EMPTY_STRING);

                            if (sas_token == NULL)
                            {
                                LogError("unable to retrieve sas token");
                                isError = true;
                            }
                            else
                            {
                                if (HTTPHeaders_AddHeaderNameValuePair(iotHubRequestHttpHeaders, HEADER_AUTHORIZATION, sas_token) != HTTP_HEADERS_OK)
                                {
                                    LogError("unable to HTTPHeaders_AddHeaderNameValuePair");
                                    isError = true;
                                }
                                else
                                {
                                    isError = false;
                                }

                                free(sas_token);
                            }
                        }

                        STRING_delete(uri_resource);
                    }

                    break;
                }
                case IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN:
                {
                    if (HTTPHeaders_AddHeaderNameValuePair(iotHubRequestHttpHeaders, HEADER_AUTHORIZATION, upload_data->credentials.supplied_sas_token) != HTTP_HEADERS_OK)
                    {
                        LogError("unable to add authorization header");
                        isError = true;
                    }
                    else
                    {
                        isError = false;
                    }
                    break;
                }
            }
        }

        if (isError)
        {
            HTTPHeaders_Free(iotHubRequestHttpHeaders);
            iotHubRequestHttpHeaders = NULL;
        }
    }

    return iotHubRequestHttpHeaders;
}